

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::read_content_with_content_receiver
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res,
          ContentReceiver *receiver)

{
  size_t payload_max_length;
  bool bVar1;
  anon_class_8_1_b7b80f6d local_88;
  ContentReceiver local_80;
  function<bool_(unsigned_long,_unsigned_long)> local_60;
  ContentReceiver *local_40;
  ContentReceiver *receiver_local;
  Response *res_local;
  Request *req_local;
  Stream *pSStack_20;
  bool last_connection_local;
  Stream *strm_local;
  Server *this_local;
  
  payload_max_length = this->payload_max_length_;
  local_40 = receiver;
  receiver_local = (ContentReceiver *)res;
  res_local = (Response *)req;
  req_local._7_1_ = last_connection;
  pSStack_20 = strm;
  strm_local = (Stream *)this;
  std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_60);
  local_88.receiver = receiver;
  std::function<bool(char_const*,unsigned_long)>::
  function<httplib::Server::read_content_with_content_receiver(httplib::Stream&,bool,httplib::Request&,httplib::Response&,std::function<bool(char_const*,unsigned_long)>)::_lambda(char_const*,unsigned_long)_1_,void>
            ((function<bool(char_const*,unsigned_long)> *)&local_80,&local_88);
  bVar1 = detail::read_content<httplib::Request>
                    (strm,req,payload_max_length,&res->status,&local_60,&local_80);
  std::function<bool_(const_char_*,_unsigned_long)>::~function(&local_80);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_60);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ =
         write_response(this,pSStack_20,(bool)(req_local._7_1_ & 1),(Request *)res_local,
                        (Response *)receiver_local);
  }
  return this_local._7_1_;
}

Assistant:

inline bool
Server::read_content_with_content_receiver(Stream &strm, bool last_connection,
                                           Request &req, Response &res,
                                           ContentReceiver receiver) {
  if (!detail::read_content(
          strm, req, payload_max_length_, res.status, Progress(),
          [&](const char *buf, size_t n) { return receiver(buf, n); })) {
    return write_response(strm, last_connection, req, res);
  }

  return true;
}